

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
llvm::cl::generic_parser_base::printOptionInfo
          (generic_parser_base *this,Option *O,size_t GlobalWidth)

{
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  raw_ostream *prVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  size_t in_R8;
  StringRef HelpStr;
  StringRef HelpStr_00;
  char *local_c8;
  StringRef Option;
  uint e_1;
  uint i_1;
  undefined8 local_80 [2];
  long local_70;
  size_t NumSpaces;
  uint e;
  uint i;
  char *local_58;
  char *local_50;
  undefined8 local_48;
  size_t local_40;
  size_t GlobalWidth_local;
  Option *O_local;
  generic_parser_base *this_local;
  char **local_20;
  undefined8 *local_18;
  long local_10;
  
  local_40 = GlobalWidth;
  GlobalWidth_local = (size_t)O;
  O_local = (Option *)this;
  bVar2 = cl::Option::hasArgStr(O);
  if (bVar2) {
    prVar4 = outs();
    prVar4 = raw_ostream::operator<<(prVar4,"  -");
    local_50 = ((StringRef *)(GlobalWidth_local + 0x18))->Data;
    local_48 = *(undefined8 *)(GlobalWidth_local + 0x20);
    raw_ostream::operator<<(prVar4,*(StringRef *)(GlobalWidth_local + 0x18));
    _e = *(Option **)(GlobalWidth_local + 0x28);
    local_58 = *(char **)(GlobalWidth_local + 0x30);
    local_10 = GlobalWidth_local + 0x18;
    HelpStr.Length = local_40;
    HelpStr.Data = local_58;
    cl::Option::printHelpStr(_e,HelpStr,*(long *)(GlobalWidth_local + 0x20) + 6,in_R8);
    NumSpaces._4_4_ = 0;
    NumSpaces._0_4_ = (*this->_vptr_generic_parser_base[2])();
    for (; sVar1 = local_40, NumSpaces._4_4_ != (uint)NumSpaces;
        NumSpaces._4_4_ = NumSpaces._4_4_ + 1) {
      iVar3 = (*this->_vptr_generic_parser_base[3])(this,(ulong)NumSpaces._4_4_);
      local_80[0] = CONCAT44(extraout_var,iVar3);
      local_18 = local_80;
      local_70 = (sVar1 - extraout_RDX) + -8;
      prVar4 = outs();
      prVar4 = raw_ostream::operator<<(prVar4,"    =");
      iVar3 = (*this->_vptr_generic_parser_base[3])(this,(ulong)NumSpaces._4_4_);
      Str_01.Data._4_4_ = extraout_var_00;
      Str_01.Data._0_4_ = iVar3;
      Str_01.Length = extraout_RDX_00;
      raw_ostream::operator<<(prVar4,Str_01);
      prVar4 = outs();
      prVar4 = raw_ostream::indent(prVar4,(uint)local_70);
      prVar4 = raw_ostream::operator<<(prVar4," -   ");
      iVar3 = (*this->_vptr_generic_parser_base[4])(this,(ulong)NumSpaces._4_4_);
      Str_00.Data._4_4_ = extraout_var_01;
      Str_00.Data._0_4_ = iVar3;
      Str_00.Length = extraout_RDX_01;
      prVar4 = raw_ostream::operator<<(prVar4,Str_00);
      raw_ostream::operator<<(prVar4,'\n');
    }
  }
  else {
    this_local = (generic_parser_base *)(GlobalWidth_local + 0x28);
    if (*(long *)(GlobalWidth_local + 0x30) != 0) {
      prVar4 = outs();
      prVar4 = raw_ostream::operator<<(prVar4,"  ");
      prVar4 = raw_ostream::operator<<(prVar4,*(StringRef *)(GlobalWidth_local + 0x28));
      raw_ostream::operator<<(prVar4,'\n');
    }
    Option.Length._4_4_ = 0;
    Option.Length._0_4_ = (*this->_vptr_generic_parser_base[2])();
    for (; Option.Length._4_4_ != (uint)Option.Length; Option.Length._4_4_ = Option.Length._4_4_ + 1
        ) {
      iVar3 = (*this->_vptr_generic_parser_base[3])(this,(ulong)Option.Length._4_4_);
      local_c8 = (char *)CONCAT44(extraout_var_02,iVar3);
      Option.Data = extraout_RDX_02;
      prVar4 = outs();
      prVar4 = raw_ostream::operator<<(prVar4,"    -");
      Str.Length = (size_t)Option.Data;
      Str.Data = local_c8;
      raw_ostream::operator<<(prVar4,Str);
      iVar3 = (*this->_vptr_generic_parser_base[4])(this,(ulong)Option.Length._4_4_);
      local_20 = &local_c8;
      HelpStr_00.Length = local_40;
      HelpStr_00.Data = extraout_RDX_03;
      cl::Option::printHelpStr
                ((Option *)CONCAT44(extraout_var_03,iVar3),HelpStr_00,(size_t)(Option.Data + 8),
                 in_R8);
    }
  }
  return;
}

Assistant:

void generic_parser_base::printOptionInfo(const Option &O,
                                          size_t GlobalWidth) const {
  if (O.hasArgStr()) {
    outs() << "  -" << O.ArgStr;
    Option::printHelpStr(O.HelpStr, GlobalWidth, O.ArgStr.size() + 6);

    for (unsigned i = 0, e = getNumOptions(); i != e; ++i) {
      size_t NumSpaces = GlobalWidth - getOption(i).size() - 8;
      outs() << "    =" << getOption(i);
      outs().indent(NumSpaces) << " -   " << getDescription(i) << '\n';
    }
  } else {
    if (!O.HelpStr.empty())
      outs() << "  " << O.HelpStr << '\n';
    for (unsigned i = 0, e = getNumOptions(); i != e; ++i) {
      auto Option = getOption(i);
      outs() << "    -" << Option;
      Option::printHelpStr(getDescription(i), GlobalWidth, Option.size() + 8);
    }
  }
}